

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffukyu(fitsfile *fptr,char *keyname,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int tstatus;
  int *in_stack_00000070;
  char *in_stack_00000078;
  char *in_stack_00000080;
  fitsfile *in_stack_00000088;
  int *in_stack_000000c0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  undefined4 local_4;
  
  if (*in_RCX < 1) {
    iVar1 = *in_RCX;
    iVar2 = ffmkyu(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
    if (iVar2 == 0xca) {
      *in_RCX = iVar1;
      ffpkyu(in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffukyu(fitsfile *fptr,      /* I - FITS file pointer  */
           const char *keyname, /* I - keyword name       */
           const char *comm,    /* I - keyword comment    */
           int *status)         /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkyu(fptr, keyname, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkyu(fptr, keyname, comm, status);
    }
    return(*status);
}